

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

StructDef * __thiscall flatbuffers::Parser::LookupStruct(Parser *this,string *id)

{
  StructDef *pSVar1;
  StructDef *sd;
  string *id_local;
  Parser *this_local;
  
  pSVar1 = SymbolTable<flatbuffers::StructDef>::Lookup(&this->structs_,id);
  if (pSVar1 != (StructDef *)0x0) {
    (pSVar1->super_Definition).refcount = (pSVar1->super_Definition).refcount + 1;
  }
  return pSVar1;
}

Assistant:

StructDef *Parser::LookupStruct(const std::string &id) const {
  auto sd = structs_.Lookup(id);
  if (sd) sd->refcount++;
  return sd;
}